

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  long in_RSI;
  int in_EDI;
  Mesh omesh;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> param;
  Mesh mesh;
  string path;
  Options local_4cc;
  string local_4c8 [8];
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
  *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  streamsize in_stack_fffffffffffffb68;
  Options *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffbd8;
  double in_stack_fffffffffffffc30;
  Mesh *in_stack_fffffffffffffc38;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
  *in_stack_fffffffffffffcd0;
  Mesh *in_stack_fffffffffffffcd8;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::__cxx11::string::string(local_30);
  if (local_8 < 2) {
    this = std::operator<<((ostream *)std::cout,"Please specify the file name");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_30);
  }
  else {
    std::__cxx11::string::operator=(local_30,*(char **)(local_10 + 8));
  }
  getOriginalMesh(in_stack_fffffffffffffbd8);
  bijectiveParameterization(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  getParameterizedMesh(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  OpenMesh::IO::Options::Options(&local_4cc,Default);
  OpenMesh::IO::write_mesh<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>>
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
             in_stack_fffffffffffffb68);
  OpenMesh::IO::Options::~Options(&local_4cc);
  std::__cxx11::string::~string(local_4c8);
  local_4 = 0;
  OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>::~PolyMesh_ArrayKernelT
            ((PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *)0x1f9740);
  std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::~vector
            (in_stack_fffffffffffffb40);
  OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>::~PolyMesh_ArrayKernelT
            ((PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *)0x1f975a);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string path;
    if (argc < 2) {
        std::cout << "Please specify the file name" << std::endl;
        std::cin >> path;
    }
    else path = argv[1];
    // Import the original mesh
    auto mesh = getOriginalMesh(path);
    // parameterize the mesh    
    auto param = bijectiveParameterization(mesh);
    // export the parameterization
    auto omesh = getParameterizedMesh(mesh, param);
    OpenMesh::IO::write_mesh(omesh, path + "_param.obj");
    return 0;
}